

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

int __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::
AddTestSuiteInstantiation
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest> *this,
          string *instantiation_name,GeneratorCreationFunc *func,ParamNameGeneratorFunc *name_func,
          char *file,int line)

{
  pointer *ppIVar1;
  pointer pcVar2;
  pointer pIVar3;
  pointer pIVar4;
  size_type sVar5;
  size_type sVar6;
  undefined8 uVar7;
  int iVar8;
  int extraout_EAX;
  ulong uVar9;
  pointer pIVar10;
  pointer pIVar11;
  char **ppcVar12;
  pointer pIVar13;
  pointer extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ulong uVar15;
  undefined4 uVar16;
  ulong uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  char *local_70;
  pointer local_68;
  char local_60;
  undefined7 uStack_5f;
  size_type sStack_58;
  GeneratorCreationFunc *local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  
  uVar16 = SUB84(file,0);
  pcVar2 = (instantiation_name->_M_dataplus)._M_p;
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + instantiation_name->_M_string_length);
  pIVar13 = local_68;
  uStack_48._4_4_ = (undefined4)((ulong)name_func >> 0x20);
  local_40 = 0xd2537d;
  uStack_3c = 0;
  pIVar3 = (this->instantiations_).
           super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::InstantiationInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = func;
  local_38 = uVar16;
  if (pIVar3 == (this->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pIVar4 = (this->instantiations_).
             super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::InstantiationInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uStack_48 = name_func;
    if ((long)pIVar3 - (long)pIVar4 == 0x7fffffffffffffc0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar17 = (long)pIVar3 - (long)pIVar4 >> 6;
    uVar9 = 1;
    if (pIVar3 != pIVar4) {
      uVar9 = uVar17;
    }
    uVar15 = uVar9 + uVar17;
    if (0x1fffffffffffffe < uVar15) {
      uVar15 = 0x1ffffffffffffff;
    }
    if (CARRY8(uVar9,uVar17)) {
      uVar15 = 0x1ffffffffffffff;
    }
    if (uVar15 == 0) {
      pIVar10 = (pointer)0x0;
    }
    else {
      pIVar10 = (pointer)operator_new(uVar15 << 6);
      name_func = uStack_48;
    }
    uStack_48._4_4_ = (undefined4)((ulong)name_func >> 0x20);
    pIVar13 = pIVar10 + uVar17;
    pIVar11 = pIVar10 + uVar17;
    paVar14 = &(pIVar11->name).field_2;
    (pIVar11->name)._M_dataplus = (_Alloc_hider)paVar14;
    if (local_70 == &local_60) {
      paVar14->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
      *(size_type *)((long)&(pIVar11->name).field_2 + 8) = sStack_58;
    }
    else {
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&pIVar13->name)->_M_allocated_capacity = (size_type)local_70;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&pIVar13->name)[1]._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    }
    *(pointer *)((long)&pIVar13->name + 8) = local_68;
    local_68 = (pointer)0x0;
    local_60 = '\0';
    *(ulong *)((long)&pIVar13->name_func + 4) = CONCAT44(local_40,uStack_48._4_4_);
    *(ulong *)((long)&pIVar13->file + 4) = CONCAT44(local_38,uStack_3c);
    pIVar13->generator = local_50;
    pIVar13->name_func = name_func;
    pIVar11 = pIVar10;
    if (pIVar3 != pIVar4) {
      pIVar11 = (pointer)&(pIVar4->name).field_2;
      paVar14 = &(pIVar10->name).field_2;
      do {
        paVar18 = paVar14;
        (&paVar18->_M_allocated_capacity)[-2] = (size_type)paVar18;
        if (pIVar11 == (pointer)pIVar11[-1].file) {
          sVar5 = *(size_type *)((long)&pIVar11->name + 8);
          paVar18->_M_allocated_capacity =
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&pIVar11->name)->_M_allocated_capacity;
          (&paVar18->_M_allocated_capacity)[1] = sVar5;
        }
        else {
          (&paVar18->_M_allocated_capacity)[-2] = (size_type)pIVar11[-1].file;
          paVar18->_M_allocated_capacity =
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&pIVar11->name)->_M_allocated_capacity;
        }
        (&paVar18->_M_allocated_capacity)[-1] = *(size_type *)&pIVar11[-1].line;
        pIVar11[-1].file = (char *)pIVar11;
        *(undefined8 *)&pIVar11[-1].line = 0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&pIVar11->name)->_M_local_buf[0] = '\0';
        sVar5 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&pIVar11->name)[1]._M_allocated_capacity;
        sVar6 = *(size_type *)((long)&pIVar11->name + 0x18);
        uVar7 = *(undefined8 *)((long)&pIVar11->generator + 4);
        *(undefined8 *)((long)paVar18 + 0x1c) = *(undefined8 *)((long)&pIVar11->name + 0x1c);
        *(undefined8 *)((long)paVar18 + 0x24) = uVar7;
        (&paVar18->_M_allocated_capacity)[2] = sVar5;
        (&paVar18->_M_allocated_capacity)[3] = sVar6;
        pIVar13 = pIVar11 + 1;
        ppcVar12 = &pIVar11->file;
        pIVar11 = pIVar13;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar18->_M_allocated_capacity + 8);
      } while ((pointer)ppcVar12 != pIVar3);
      pIVar11 = (pointer)(&paVar18->_M_allocated_capacity + 6);
    }
    local_70 = &local_60;
    uStack_48 = name_func;
    if (pIVar4 != (pointer)0x0) {
      operator_delete(pIVar4);
      pIVar13 = extraout_RAX;
    }
    (this->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = pIVar10;
    (this->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar11 + 1;
    (this->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pIVar10 + uVar15;
    name_func = uStack_48;
  }
  else {
    paVar14 = &(pIVar3->name).field_2;
    (pIVar3->name)._M_dataplus._M_p = (pointer)paVar14;
    if (local_70 == &local_60) {
      paVar14->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
      *(size_type *)((long)&(pIVar3->name).field_2 + 8) = sStack_58;
    }
    else {
      (pIVar3->name)._M_dataplus._M_p = local_70;
      (pIVar3->name).field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    }
    (pIVar3->name)._M_string_length = (size_type)local_68;
    local_68 = (pointer)0x0;
    local_60 = '\0';
    *(ulong *)((long)&pIVar3->name_func + 4) = CONCAT44(0xd2537d,uStack_48._4_4_);
    *(long *)((long)&pIVar3->file + 4) = (long)file << 0x20;
    pIVar3->generator = func;
    pIVar3->name_func = name_func;
    ppIVar1 = &(this->instantiations_).
               super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADavgTest>::InstantiationInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
    local_70 = &local_60;
  }
  iVar8 = (int)pIVar13;
  if (local_70 != &local_60) {
    uStack_48 = name_func;
    operator_delete(local_70);
    iVar8 = extraout_EAX;
  }
  return iVar8;
}

Assistant:

int AddTestSuiteInstantiation(const std::string& instantiation_name,
                                GeneratorCreationFunc* func,
                                ParamNameGeneratorFunc* name_func,
                                const char* file, int line) {
    instantiations_.push_back(
        InstantiationInfo(instantiation_name, func, name_func, file, line));
    return 0;  // Return value used only to run this method in namespace scope.
  }